

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

void __thiscall
kj::TlsPrivateKey::TlsPrivateKey(TlsPrivateKey *this,StringPtr pem,Maybe<kj::StringPtr> *password)

{
  char *buf;
  size_t sVar1;
  EVP_PKEY *pEVar2;
  Type local_48;
  undefined1 local_40 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:1011:3)>
  _kjDefer1011;
  BIO *bio;
  Maybe<kj::StringPtr> *password_local;
  TlsPrivateKey *this_local;
  StringPtr pem_local;
  
  pem_local.content.ptr = (char *)pem.content.size_;
  this_local = (TlsPrivateKey *)pem.content.ptr;
  anon_unknown_307::ensureOpenSslInitialized();
  buf = StringPtr::begin((StringPtr *)&this_local);
  sVar1 = StringPtr::size((StringPtr *)&this_local);
  _kjDefer1011.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:1011:3)>_2
        )BIO_new_mem_buf(buf,(int)sVar1);
  local_48.bio = (BIO **)&_kjDefer1011.maybeFunc.ptr.field_1;
  defer<kj::TlsPrivateKey::TlsPrivateKey(kj::StringPtr,kj::Maybe<kj::StringPtr>)::__0>
            ((kj *)local_40,&local_48);
  pEVar2 = PEM_read_bio_PrivateKey
                     ((BIO *)_kjDefer1011.maybeFunc.ptr.field_1,(EVP_PKEY **)0x0,passwordCallback,
                      password);
  this->pkey = pEVar2;
  if (this->pkey == (void *)0x0) {
    anon_unknown_307::throwOpensslError();
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:1011:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:1011:3)>
               *)local_40);
  return;
}

Assistant:

TlsPrivateKey::TlsPrivateKey(kj::StringPtr pem, kj::Maybe<kj::StringPtr> password) {
  ensureOpenSslInitialized();

  // const_cast apparently needed for older versions of OpenSSL.
  BIO* bio = BIO_new_mem_buf(const_cast<char*>(pem.begin()), pem.size());
  KJ_DEFER(BIO_free(bio));

  pkey = PEM_read_bio_PrivateKey(bio, nullptr, &passwordCallback, &password);
  if (pkey == nullptr) {
    throwOpensslError();
  }
}